

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.hpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::XMLUri::getUriText(XMLUri *this)

{
  XMLUri *this_local;
  
  if (this->fURIText == (XMLCh *)0x0) {
    buildFullText(this);
  }
  return this->fURIText;
}

Assistant:

inline const XMLCh* XMLUri::getUriText() const
{
    //
    //  Fault it in if not already. Since this is a const method and we
    //  can't use mutable members due the compilers we have to support,
    //  we have to cast off the constness.
    //
    if (!fURIText)
        (const_cast<XMLUri *>(this))->buildFullText();

    return fURIText;
}